

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_scatter_send(REF_MPI ref_mpi,void *data,REF_INT n,REF_TYPE type,REF_INT dest)

{
  REF_INT dest_local;
  REF_TYPE type_local;
  REF_INT n_local;
  void *data_local;
  REF_MPI ref_mpi_local;
  
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_scatter_send(REF_MPI ref_mpi, void *data, REF_INT n,
                                        REF_TYPE type, REF_INT dest) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;
  REF_INT tag;

  ref_type_mpi_type(type, datatype);

  tag = dest;

  RAB(0 <= tag && tag <= ref_mpi_max_tag(ref_mpi), "mpi tag outside bound",
      { printf("tag %d bound %d\n", tag, ref_mpi_max_tag(ref_mpi)); });

  MPI_Send(data, n, datatype, dest, tag, ref_mpi_comm(ref_mpi));

  return REF_SUCCESS;
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(data);
  SUPRESS_UNUSED_COMPILER_WARNING(n);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
  SUPRESS_UNUSED_COMPILER_WARNING(dest);
  return REF_IMPLEMENT;
#endif
}